

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::Imputer::Imputer(Imputer *this,Imputer *from)

{
  uint32_t uVar1;
  ulong uVar2;
  ulong uVar3;
  Int64Vector *this_00;
  DoubleVector *this_01;
  StringToDoubleMap *this_02;
  Int64ToDoubleMap *this_03;
  undefined8 *puVar4;
  undefined1 *puVar5;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Imputer_003f9a88;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  this->_oneof_case_[0] = 0;
  switch(from->_oneof_case_[0]) {
  case 1:
    _internal_set_imputeddoublevalue(this,(from->ImputedValue_).imputeddoublevalue_);
    break;
  case 2:
    _internal_set_imputedint64value(this,(from->ImputedValue_).imputedint64value_);
    break;
  case 3:
    uVar2 = (from->ImputedValue_).imputedint64value_;
    clear_ImputedValue(this);
    this->_oneof_case_[0] = 3;
    (this->ImputedValue_).imputeddoublevalue_ =
         (double)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar4 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      puVar4 = (undefined8 *)*puVar4;
    }
    google::protobuf::internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)&this->ImputedValue_,uVar2 & 0xfffffffffffffffe,puVar4);
    break;
  case 4:
    this_01 = _internal_mutable_imputeddoublearray(this);
    if (from->_oneof_case_[0] == 4) {
      puVar5 = (undefined1 *)(from->ImputedValue_).imputeddoublearray_;
    }
    else {
      puVar5 = _DoubleVector_default_instance_;
    }
    DoubleVector::MergeFrom(this_01,(DoubleVector *)puVar5);
    break;
  case 5:
    this_00 = _internal_mutable_imputedint64array(this);
    if (from->_oneof_case_[0] == 5) {
      puVar5 = (undefined1 *)(from->ImputedValue_).imputedint64array_;
    }
    else {
      puVar5 = _Int64Vector_default_instance_;
    }
    Int64Vector::MergeFrom(this_00,(Int64Vector *)puVar5);
    break;
  case 6:
    this_02 = _internal_mutable_imputedstringdictionary(this);
    if (from->_oneof_case_[0] == 6) {
      puVar5 = (undefined1 *)(from->ImputedValue_).imputedstringdictionary_;
    }
    else {
      puVar5 = _StringToDoubleMap_default_instance_;
    }
    StringToDoubleMap::MergeFrom(this_02,(StringToDoubleMap *)puVar5);
    break;
  case 7:
    this_03 = _internal_mutable_imputedint64dictionary(this);
    if (from->_oneof_case_[0] == 7) {
      puVar5 = (undefined1 *)(from->ImputedValue_).imputedint64dictionary_;
    }
    else {
      puVar5 = _Int64ToDoubleMap_default_instance_;
    }
    Int64ToDoubleMap::MergeFrom(this_03,(Int64ToDoubleMap *)puVar5);
  }
  this->_oneof_case_[1] = 0;
  uVar1 = from->_oneof_case_[1];
  if (uVar1 == 0xd) {
    uVar2 = (from->ReplaceValue_).replaceint64value_;
    clear_ReplaceValue(this);
    this->_oneof_case_[1] = 0xd;
    (this->ReplaceValue_).replacedoublevalue_ =
         (double)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar4 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      puVar4 = (undefined8 *)*puVar4;
    }
    google::protobuf::internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)&this->ReplaceValue_,uVar2 & 0xfffffffffffffffe,puVar4);
  }
  else if (uVar1 == 0xc) {
    _internal_set_replaceint64value(this,(from->ReplaceValue_).replaceint64value_);
  }
  else if (uVar1 == 0xb) {
    _internal_set_replacedoublevalue(this,(from->ReplaceValue_).replacedoublevalue_);
  }
  return;
}

Assistant:

Imputer::Imputer(const Imputer& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  clear_has_ImputedValue();
  switch (from.ImputedValue_case()) {
    case kImputedDoubleValue: {
      _internal_set_imputeddoublevalue(from._internal_imputeddoublevalue());
      break;
    }
    case kImputedInt64Value: {
      _internal_set_imputedint64value(from._internal_imputedint64value());
      break;
    }
    case kImputedStringValue: {
      _internal_set_imputedstringvalue(from._internal_imputedstringvalue());
      break;
    }
    case kImputedDoubleArray: {
      _internal_mutable_imputeddoublearray()->::CoreML::Specification::DoubleVector::MergeFrom(from._internal_imputeddoublearray());
      break;
    }
    case kImputedInt64Array: {
      _internal_mutable_imputedint64array()->::CoreML::Specification::Int64Vector::MergeFrom(from._internal_imputedint64array());
      break;
    }
    case kImputedStringDictionary: {
      _internal_mutable_imputedstringdictionary()->::CoreML::Specification::StringToDoubleMap::MergeFrom(from._internal_imputedstringdictionary());
      break;
    }
    case kImputedInt64Dictionary: {
      _internal_mutable_imputedint64dictionary()->::CoreML::Specification::Int64ToDoubleMap::MergeFrom(from._internal_imputedint64dictionary());
      break;
    }
    case IMPUTEDVALUE_NOT_SET: {
      break;
    }
  }
  clear_has_ReplaceValue();
  switch (from.ReplaceValue_case()) {
    case kReplaceDoubleValue: {
      _internal_set_replacedoublevalue(from._internal_replacedoublevalue());
      break;
    }
    case kReplaceInt64Value: {
      _internal_set_replaceint64value(from._internal_replaceint64value());
      break;
    }
    case kReplaceStringValue: {
      _internal_set_replacestringvalue(from._internal_replacestringvalue());
      break;
    }
    case REPLACEVALUE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.Imputer)
}